

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

bool P_LookForTID(AActor *actor,INTBOOL allaround,FLookExParams *params)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  AActor **ppAVar7;
  AActor *pAVar8;
  byte bVar9;
  bool bVar10;
  int iVar11;
  
  if (params == (FLookExParams *)0x0) {
    bVar9 = 0;
  }
  else {
    bVar9 = ((byte)params->flags & 4) >> 2;
  }
  pAVar5 = P_BlockmapSearch(actor,0,LookForTIDInBlock,params);
  if (pAVar5 != (AActor *)0x0) {
    pAVar6 = (actor->goal).field_0.p;
    if (pAVar6 != (AActor *)0x0) {
      if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar6 = (actor->goal).field_0.p;
        if ((pAVar6 != (AActor *)0x0) &&
           (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (actor->goal).field_0.p = (AActor *)0x0;
          pAVar6 = (AActor *)0x0;
        }
        pAVar8 = (actor->target).field_0.p;
        if ((pAVar8 != (AActor *)0x0) &&
           (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (actor->target).field_0.p = (AActor *)0x0;
          pAVar8 = (AActor *)0x0;
        }
        if (pAVar8 == pAVar6) {
          actor->reactiontime = 0;
        }
      }
      else {
        (actor->goal).field_0.p = (AActor *)0x0;
      }
    }
    (actor->target).field_0.p = pAVar5;
    (actor->LastLookActor).field_0.p = pAVar5;
    return true;
  }
  pAVar5 = (actor->LastLookActor).field_0.p;
  if ((pAVar5 != (AActor *)0x0) &&
     ((((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 ||
      (((actor->LastLookActor).field_0.p)->tid != actor->TIDtoHate)))) {
    (actor->LastLookActor).field_0.p = (AActor *)0x0;
  }
  uVar1 = actor->TIDtoHate;
  pAVar5 = (actor->LastLookActor).field_0.p;
  if ((pAVar5 != (AActor *)0x0) &&
     (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (actor->LastLookActor).field_0.p = (AActor *)0x0;
    pAVar5 = (AActor *)0x0;
  }
  uVar4 = FRandom::GenRand32(&pr_look3);
  iVar11 = (uVar4 & 0x1f) + 7;
  bVar3 = false;
LAB_003eef30:
  do {
    bVar10 = bVar3;
    pAVar6 = (actor->LastLookActor).field_0.p;
    do {
      if (uVar1 == 0) {
        pAVar8 = (AActor *)0x0;
      }
      else {
        ppAVar7 = &pAVar5->inext;
        if (pAVar5 == (AActor *)0x0) {
          ppAVar7 = (AActor **)((long)AActor::TIDHash + (ulong)((uVar1 & 0x7f) << 3));
        }
        for (pAVar8 = *ppAVar7; (pAVar5 = pAVar8, pAVar8 != (AActor *)0x0 && (pAVar8->tid != uVar1))
            ; pAVar8 = pAVar8->inext) {
        }
      }
      if ((pAVar6 != (AActor *)0x0) &&
         (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (actor->LastLookActor).field_0.p = (AActor *)0x0;
        pAVar6 = (AActor *)0x0;
      }
      if (pAVar8 == pAVar6) goto LAB_003ef019;
      if (pAVar8 == (AActor *)0x0) {
        bVar3 = true;
        if (bVar10) goto LAB_003ef019;
        goto LAB_003eef30;
      }
    } while ((((pAVar8 == actor) || (((pAVar8->flags).Value & 4) == 0)) || (pAVar8->health < 1)) ||
            (((pAVar8->flags2).Value & 0x10000000) != 0));
    iVar11 = iVar11 + -1;
    if (iVar11 == 0) {
LAB_003ef019:
      (actor->LastLookActor).field_0.p = pAVar8;
      pAVar5 = (actor->target).field_0.p;
      if (pAVar5 != (AActor *)0x0) {
        if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          return false;
        }
        (actor->target).field_0.p = (AActor *)0x0;
      }
      pAVar5 = (actor->goal).field_0.p;
      if (pAVar5 != (AActor *)0x0) {
        if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (bVar9 == 0) {
            (actor->target).field_0 = (actor->goal).field_0;
            return true;
          }
        }
        else {
          (actor->goal).field_0.p = (AActor *)0x0;
        }
      }
      pAVar5 = (actor->lastenemy).field_0.p;
      if (pAVar5 != (AActor *)0x0) {
        if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (((actor->lastenemy).field_0.p)->health < 1) {
            return false;
          }
          pAVar5 = (actor->lastenemy).field_0.p;
          if ((pAVar5 != (AActor *)0x0) &&
             (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (actor->lastenemy).field_0.p = (AActor *)0x0;
            pAVar5 = (AActor *)0x0;
          }
          bVar3 = AActor::IsFriend(actor,pAVar5);
          if (!bVar3) {
            (actor->target).field_0 = (actor->lastenemy).field_0;
            (actor->lastenemy).field_0.p = (AActor *)0x0;
            return true;
          }
        }
        (actor->lastenemy).field_0.p = (AActor *)0x0;
      }
      return false;
    }
    if ((((actor->flags3).Value & 0x80) != 0) ||
       (bVar2 = P_IsVisible(actor,pAVar8,(uint)(allaround != 0),params), bVar3 = bVar10, bVar2)) {
      pAVar5 = (actor->goal).field_0.p;
      if (pAVar5 != (AActor *)0x0) {
        if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          pAVar5 = (actor->goal).field_0.p;
          if ((pAVar5 != (AActor *)0x0) &&
             (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (actor->goal).field_0.p = (AActor *)0x0;
            pAVar5 = (AActor *)0x0;
          }
          pAVar6 = (actor->target).field_0.p;
          if ((pAVar6 != (AActor *)0x0) &&
             (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (actor->target).field_0.p = (AActor *)0x0;
            pAVar6 = (AActor *)0x0;
          }
          if (pAVar6 == pAVar5) {
            actor->reactiontime = 0;
          }
        }
        else {
          (actor->goal).field_0.p = (AActor *)0x0;
        }
      }
      (actor->target).field_0.p = pAVar8;
      (actor->LastLookActor).field_0.p = pAVar8;
      return true;
    }
  } while( true );
}

Assistant:

bool P_LookForTID (AActor *actor, INTBOOL allaround, FLookExParams *params)
{
	AActor *other;
	bool reachedend = false;
	bool chasegoal = params? (!(params->flags & LOF_DONTCHASEGOAL)) : true;

	other = P_BlockmapSearch (actor, 0, LookForTIDInBlock, params);

	if (other != NULL)
	{
		if (actor->goal && actor->target == actor->goal)
			actor->reactiontime = 0;

		actor->target = other;
		actor->LastLookActor = other;
		return true;
	}

	// The actor's TID could change because of death or because of
	// Thing_ChangeTID. If it's not what we expect, then don't use
	// it as a base for the iterator.
	if (actor->LastLookActor != NULL &&
		actor->LastLookActor->tid != actor->TIDtoHate)
	{
		actor->LastLookActor = NULL;
	}

	FActorIterator iterator (actor->TIDtoHate, actor->LastLookActor);
	int c = (pr_look3() & 31) + 7;	// Look for between 7 and 38 hatees at a time
	while ((other = iterator.Next()) != actor->LastLookActor)
	{
		if (other == NULL)
		{
			if (reachedend)
			{
				// we have cycled through the entire list at least once
				// so let's abort because even if we continue nothing can
				// be found.
				break;
			}
			reachedend = true;
			continue;
		}

		if (!(other->flags & MF_SHOOTABLE))
			continue;			// not shootable (observer or dead)

		if (other == actor)
			continue;			// don't hate self

		if (other->health <= 0)
			continue;			// dead

		if (other->flags2 & MF2_DORMANT)
			continue;			// don't target dormant things

		if (--c == 0)
			break;

		if (!(actor->flags3 & MF3_NOSIGHTCHECK))
		{
			if (!P_IsVisible (actor, other, !!allaround, params))
				continue;			// out of sight
		}
		
		// [RH] Need to be sure the reactiontime is 0 if the monster is
		//		leaving its goal to go after something else.
		if (actor->goal && actor->target == actor->goal)
			actor->reactiontime = 0;

		actor->target = other;
		actor->LastLookActor = other;
		return true;
	}
	actor->LastLookActor = other;
	if (actor->target == NULL)
	{
		// [RH] use goal as target
		if (actor->goal != NULL && chasegoal)
		{
			actor->target = actor->goal;
			return true;
		}
		// Use last known enemy if no hatee sighted -- killough 2/15/98:
		if (actor->lastenemy != NULL && actor->lastenemy->health > 0)
		{
			if (!actor->IsFriend(actor->lastenemy))
			{
				actor->target = actor->lastenemy;
				actor->lastenemy = NULL;
				return true;
			}
			else
			{
				actor->lastenemy = NULL;
			}
		}
	}
	return false;
}